

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::OrderDependsTargetForTarget_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_38 [2];
  long local_28 [2];
  
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + psVar3->_M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x4c5955);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmNinjaTargetGenerator::OrderDependsTargetForTarget()
{
  return "cmake_order_depends_target_" + this->GetTargetName();
}